

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

bool __thiscall HPack::FieldLookupTable::updateDynamicTableSize(FieldLookupTable *this,quint32 size)

{
  bool bVar1;
  
  if (size == 0) {
    clearDynamicTable(this);
    this->tableCapacity = 0;
    bVar1 = true;
  }
  else if (this->maxTableSize < size) {
    bVar1 = false;
  }
  else {
    this->tableCapacity = size;
    while ((bVar1 = true, this->nDynamic != 0 && (this->tableCapacity < this->dataSize))) {
      evictEntry(this);
    }
  }
  return bVar1;
}

Assistant:

bool FieldLookupTable::updateDynamicTableSize(quint32 size)
{
    if (!size) {
        clearDynamicTable();
        tableCapacity = 0;
        return true;
    }

    if (size > maxTableSize)
        return false;

    tableCapacity = size;
    while (nDynamic && dataSize > tableCapacity)
        evictEntry();

    return true;
}